

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetGridData
          (Gridded_Data_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
          *GD)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  int iVar3;
  pointer pKVar4;
  
  pKVar2 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vGridData).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    iVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[6])();
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - (short)iVar3;
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::operator=(&this->m_vGridData,GD);
  pKVar4 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui8VecDim = (char)((uint)((int)pKVar2 - (int)pKVar4) >> 3) * -0x55;
  for (; pKVar2 != pKVar4; pKVar4 = pKVar4 + 1) {
    iVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[6])();
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (short)iVar3;
  }
  return;
}

Assistant:

void Gridded_Data_PDU::SetGridData( const std::vector<GridDataPtr> & GD )
{
    // Remove the old grid data from the PDU length.
    std::vector<GridDataPtr>::const_iterator citr = m_vGridData.begin();
    std::vector<GridDataPtr>::const_iterator citrEnd = m_vGridData.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= ( *citr )->GetSize();
    }

    m_vGridData = GD;
    m_ui8VecDim = m_vGridData.size();

    // Now recalculate the PDU length.
    citr = m_vGridData.begin();
    citrEnd = m_vGridData.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetSize();
    }
}